

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzyHammerer.cpp
# Opt level: O2

void FuzzyHammerer::generate_pattern_for_ARM
               (int acts,int *rows_to_access,int max_accesses,size_t probes_per_pattern)

{
  int base_period;
  undefined1 local_3cc8 [8];
  PatternBuilder pattern_builder;
  FuzzingParameterSet fuzzing_params;
  PatternAddressMapper mapper;
  allocator<char> local_29;
  
  FuzzingParameterSet::FuzzingParameterSet
            ((FuzzingParameterSet *)&pattern_builder.aggressor_id_counter,acts);
  FuzzingParameterSet::print_static_parameters
            ((FuzzingParameterSet *)&pattern_builder.aggressor_id_counter);
  FuzzingParameterSet::randomize_parameters
            ((FuzzingParameterSet *)&pattern_builder.aggressor_id_counter,true);
  if (hammering_pattern.aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      hammering_pattern.aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl
      .super__Vector_impl_data._M_start) {
    hammering_pattern.aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
    super__Vector_impl_data._M_finish =
         hammering_pattern.aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  if (cnt_pattern_probes < probes_per_pattern && 1 < cnt_pattern_probes) {
    cnt_pattern_probes = cnt_pattern_probes + 1;
  }
  else {
    cnt_pattern_probes = 0;
    base_period = FuzzingParameterSet::get_base_period
                            ((FuzzingParameterSet *)&pattern_builder.aggressor_id_counter);
    HammeringPattern::HammeringPattern
              ((HammeringPattern *)&fuzzing_params.flushing_strategy,base_period);
    HammeringPattern::operator=
              (&hammering_pattern,(HammeringPattern *)&fuzzing_params.flushing_strategy);
    HammeringPattern::~HammeringPattern((HammeringPattern *)&fuzzing_params.flushing_strategy);
  }
  PatternBuilder::PatternBuilder((PatternBuilder *)local_3cc8,&hammering_pattern);
  PatternBuilder::generate_frequency_based_pattern
            ((PatternBuilder *)local_3cc8,
             (FuzzingParameterSet *)&pattern_builder.aggressor_id_counter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fuzzing_params.flushing_strategy,
             "Aggressor pairs, given as \"(id ...) : freq, amp, start_offset\":",
             (allocator<char> *)&mapper.reproducibility_score);
  Logger::log_info((string *)&fuzzing_params.flushing_strategy,true);
  std::__cxx11::string::~string((string *)&fuzzing_params.flushing_strategy);
  HammeringPattern::get_agg_access_pairs_text_repr_abi_cxx11_
            ((string *)&fuzzing_params.flushing_strategy,&hammering_pattern);
  Logger::log_data((string *)&fuzzing_params.flushing_strategy,true);
  std::__cxx11::string::~string((string *)&fuzzing_params.flushing_strategy);
  PatternAddressMapper::PatternAddressMapper
            ((PatternAddressMapper *)&fuzzing_params.flushing_strategy);
  PatternAddressMapper::randomize_addresses
            ((PatternAddressMapper *)&fuzzing_params.flushing_strategy,
             (FuzzingParameterSet *)&pattern_builder.aggressor_id_counter,
             &hammering_pattern.agg_access_patterns,true);
  PatternAddressMapper::export_pattern
            ((PatternAddressMapper *)&fuzzing_params.flushing_strategy,&hammering_pattern.aggressors
             ,(long)hammering_pattern.base_period,rows_to_access,(long)max_accesses);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mapper.reproducibility_score,
             "Aggressor ID to DRAM address mapping (bank, rank, column):",&local_29);
  Logger::log_info((string *)&mapper.reproducibility_score,true);
  std::__cxx11::string::~string((string *)&mapper.reproducibility_score);
  PatternAddressMapper::get_mapping_text_repr_abi_cxx11_
            ((string *)&mapper.reproducibility_score,
             (PatternAddressMapper *)&fuzzing_params.flushing_strategy);
  Logger::log_data((string *)&mapper.reproducibility_score,true);
  std::__cxx11::string::~string((string *)&mapper.reproducibility_score);
  PatternAddressMapper::~PatternAddressMapper
            ((PatternAddressMapper *)&fuzzing_params.flushing_strategy);
  std::discrete_distribution<int>::param_type::~param_type
            ((param_type *)&fuzzing_params.wait_until_start_hammering_refs.dist._M_param._M_b);
  return;
}

Assistant:

void FuzzyHammerer::generate_pattern_for_ARM(int acts,
                                             int *rows_to_access,
                                             int max_accesses,
                                             const size_t probes_per_pattern) {
  FuzzingParameterSet fuzzing_params(acts);
  fuzzing_params.print_static_parameters();
  fuzzing_params.randomize_parameters(true);

  hammering_pattern.aggressors.clear();
  if (cnt_pattern_probes > 1 && cnt_pattern_probes < probes_per_pattern) {
    cnt_pattern_probes++;
  } else {
    cnt_pattern_probes = 0;
    hammering_pattern = HammeringPattern(fuzzing_params.get_base_period());
  }

  PatternBuilder pattern_builder(hammering_pattern);
  pattern_builder.generate_frequency_based_pattern(fuzzing_params);

  Logger::log_info("Aggressor pairs, given as \"(id ...) : freq, amp, start_offset\":");
  Logger::log_data(hammering_pattern.get_agg_access_pairs_text_repr());

  // choose random addresses for pattern
  PatternAddressMapper mapper;
  mapper.randomize_addresses(fuzzing_params, hammering_pattern.agg_access_patterns, true);
  mapper.export_pattern(hammering_pattern.aggressors, hammering_pattern.base_period, rows_to_access, max_accesses);
  Logger::log_info("Aggressor ID to DRAM address mapping (bank, rank, column):");
  Logger::log_data(mapper.get_mapping_text_repr());
}